

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  int *piVar1;
  Fts5Config *pFVar2;
  sqlite3_stmt *pStmt;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  sqlite3_stmt **ppStmt_00;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar9 = (ulong)(uint)eStmt;
  ppStmt_00 = p->aStmt + uVar9;
  iVar8 = 0;
  if (*ppStmt_00 != (sqlite3_stmt *)0x0) goto LAB_001c2096;
  pFVar2 = p->pConfig;
  switch(uVar9) {
  case 0:
  case 1:
    pcVar5 = sqlite3_mprintf((&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9],pFVar2->zContentExprlist,
                             pFVar2->zContent,pFVar2->zContentRowid,pFVar2->zContentRowid);
    break;
  case 2:
  case 3:
    pcVar4 = (&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9];
    pcVar5 = pFVar2->zContentExprlist;
    pcVar7 = pFVar2->zContent;
    pcVar6 = pFVar2->zContentRowid;
    goto LAB_001c1fc1;
  case 4:
  case 5:
    pcVar4 = (char *)0x0;
    iVar8 = local_3c;
    uVar11 = 0;
    while ((uVar10 = uVar11 + 1, iVar8 == 0 && ((long)uVar11 <= (long)pFVar2->nCol))) {
      if ((uVar10 == 1) || ((pFVar2->eContent == 0 || (pFVar2->abUnindexed[uVar11 - 1] != '\0')))) {
        pcVar5 = ",";
        if (pcVar4 == (char *)0x0) {
          pcVar5 = "";
        }
        pcVar4 = sqlite3Fts5Mprintf(&local_3c,"%z%s?%d",pcVar4,pcVar5,uVar10 & 0xffffffff);
        iVar8 = local_3c;
        uVar11 = uVar10;
      }
      else {
        iVar8 = 0;
        uVar11 = uVar10;
      }
    }
    if ((pFVar2->bLocale != 0) && (pFVar2->eContent == 0)) {
      for (lVar12 = 0; (iVar8 == 0 && (lVar12 < pFVar2->nCol)); lVar12 = lVar12 + 1) {
        iVar8 = 0;
        if (pFVar2->abUnindexed[lVar12] == '\0') {
          pcVar4 = sqlite3Fts5Mprintf(&local_3c,"%z,?%d",pcVar4,
                                      (ulong)(pFVar2->nCol + (int)lVar12 + 2));
          iVar8 = local_3c;
        }
      }
    }
    pcVar5 = sqlite3Fts5Mprintf(&local_3c,(&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9],pFVar2->zDb,
                                pFVar2->zName,pcVar4);
    sqlite3_free(pcVar4);
    break;
  default:
    pcVar5 = (&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9];
    pcVar4 = pFVar2->zDb;
    pcVar7 = pFVar2->zName;
    goto LAB_001c1ff2;
  case 7:
    pcVar4 = (&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9];
    pcVar5 = pFVar2->zDb;
    pcVar7 = pFVar2->zName;
    pcVar6 = ",?";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar6 = "";
    }
    goto LAB_001c1fc1;
  case 9:
    pcVar4 = (&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9];
    pcVar5 = ",origin";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar5 = "";
    }
    pcVar7 = pFVar2->zDb;
    pcVar6 = pFVar2->zName;
LAB_001c1fc1:
    pcVar5 = sqlite3_mprintf(pcVar4,pcVar5,pcVar7,pcVar6);
    break;
  case 0xb:
    pcVar5 = (&PTR_anon_var_dwarf_7cec1_0022a1b0)[uVar9];
    pcVar7 = pFVar2->zContent;
    pcVar4 = pFVar2->zContentExprlist;
LAB_001c1ff2:
    pcVar5 = sqlite3_mprintf(pcVar5,pcVar4,pcVar7);
  }
  if (pcVar5 == (char *)0x0) {
    iVar8 = 7;
  }
  else {
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + 1;
    iVar3 = sqlite3_prepare_v3(pFVar2->db,pcVar5,-1,(uint)(3 < eStmt) * 4 + 1,ppStmt_00,(char **)0x0
                              );
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + -1;
    sqlite3_free(pcVar5);
    if ((pzErrMsg != (char **)0x0) && (iVar3 != 0)) {
      pcVar5 = sqlite3_errmsg(pFVar2->db);
      pcVar5 = sqlite3_mprintf("%s",pcVar5);
      *pzErrMsg = pcVar5;
    }
    iVar8 = 0xb;
    if (iVar3 != 1) {
      iVar8 = iVar3;
    }
    if (6 < eStmt - 4U) {
      iVar8 = iVar3;
    }
  }
LAB_001c2096:
  pStmt = *ppStmt_00;
  *ppStmt = pStmt;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3_reset(pStmt);
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP2  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?%s)",     /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz%s FROM %Q.'%q_docsize' WHERE id=?",    /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    assert( ArraySize(azStmt)==ArraySize(p->aStmt) );

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist,
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
      case FTS5_STMT_LOOKUP2:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT:
      case FTS5_STMT_REPLACE_CONTENT: {
        char *zBind = 0;
        int i;

        assert( pC->eContent==FTS5_CONTENT_NORMAL
             || pC->eContent==FTS5_CONTENT_UNINDEXED
        );

        /* Add bindings for the "c*" columns - those that store the actual
        ** table content. If eContent==NORMAL, then there is one binding
        ** for each column. Or, if eContent==UNINDEXED, then there are only
        ** bindings for the UNINDEXED columns. */
        for(i=0; rc==SQLITE_OK && i<(pC->nCol+1); i++){
          if( !i || pC->eContent==FTS5_CONTENT_NORMAL || pC->abUnindexed[i-1] ){
            zBind = sqlite3Fts5Mprintf(&rc, "%z%s?%d", zBind, zBind?",":"",i+1);
          }
        }

        /* Add bindings for any "l*" columns. Only non-UNINDEXED columns
        ** require these.  */
        if( pC->bLocale && pC->eContent==FTS5_CONTENT_NORMAL ){
          for(i=0; rc==SQLITE_OK && i<pC->nCol; i++){
            if( pC->abUnindexed[i]==0 ){
              zBind = sqlite3Fts5Mprintf(&rc, "%z,?%d", zBind, pC->nCol+i+2);
            }
          }
        }

        zSql = sqlite3Fts5Mprintf(&rc, azStmt[eStmt], pC->zDb, pC->zName,zBind);
        sqlite3_free(zBind);
        break;
      }

      case FTS5_STMT_REPLACE_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName,
          (pC->bContentlessDelete ? ",?" : "")
        );
        break;

      case FTS5_STMT_LOOKUP_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            (pC->bContentlessDelete ? ",origin" : ""),
            pC->zDb, pC->zName
        );
        break;

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP2 ) f |= SQLITE_PREPARE_NO_VTAB;
      p->pConfig->bLock++;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      p->pConfig->bLock--;
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
      if( rc==SQLITE_ERROR && eStmt>FTS5_STMT_LOOKUP2 && eStmt<FTS5_STMT_SCAN ){
        /* One of the internal tables - not the %_content table - is missing.
        ** This counts as a corrupted table.  */
       rc = SQLITE_CORRUPT;
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}